

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O3

int64_t helper_fistll_ST0_x86_64(CPUX86State *env)

{
  byte bVar1;
  byte bVar2;
  int64_t iVar3;
  floatx80 a;
  
  bVar1 = (env->fp_status).float_exception_flags;
  (env->fp_status).float_exception_flags = '\0';
  a._8_4_ = *(undefined4 *)((long)env->fpregs + (ulong)env->fpstt * 0x10 + 8);
  a.low = env->fpregs[env->fpstt].d.low;
  a._12_4_ = 0;
  iVar3 = floatx80_to_int64_x86_64(a,&env->fp_status);
  bVar2 = (env->fp_status).float_exception_flags;
  if ((bVar2 & 1) != 0) {
    iVar3 = -0x8000000000000000;
  }
  (env->fp_status).float_exception_flags = bVar1 | bVar2;
  return iVar3;
}

Assistant:

int64_t helper_fistll_ST0(CPUX86State *env)
{
    int64_t val;
    signed char old_exp_flags;

    old_exp_flags = get_float_exception_flags(&env->fp_status);
    set_float_exception_flags(0, &env->fp_status);

    val = floatx80_to_int64(ST0, &env->fp_status);
    if (get_float_exception_flags(&env->fp_status) & float_flag_invalid) {
        val = 0x8000000000000000ULL;
    }
    set_float_exception_flags(get_float_exception_flags(&env->fp_status)
                                | old_exp_flags, &env->fp_status);
    return val;
}